

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

void __thiscall
Assimp::IFCImporter::InternReadFile
          (IFCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  string *__rhs;
  _Base_ptr *pp_Var1;
  size_type *psVar2;
  ObjectMapByType *this_00;
  pointer pcVar3;
  size_type sVar4;
  pointer pLVar5;
  undefined8 *puVar6;
  _Alloc_hider _Var7;
  _Head_base<0UL,_Assimp::STEP::DB_*,_false> _Var8;
  aiScene *paVar9;
  pointer __src;
  pointer ppaVar10;
  pointer __src_00;
  pointer ppaVar11;
  undefined4 uVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  long lVar15;
  long lVar16;
  size_t sVar17;
  uint8_t *puVar18;
  MemoryIOStream *__p;
  long *plVar19;
  const_iterator cVar20;
  IfcUnitAssignment *pIVar21;
  IfcRepresentationContext *pIVar22;
  void *pvVar23;
  Object *pOVar24;
  aiNode *paVar25;
  undefined8 *puVar26;
  LazyObject *pLVar27;
  IfcObjectDefinition *pIVar28;
  aiNode *paVar29;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var30;
  _Base_ptr p_Var31;
  char *pcVar32;
  aiNode **ppaVar33;
  aiMesh **__s;
  aiMaterial **__s_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  ulong *puVar35;
  undefined8 uVar36;
  ulong uVar37;
  char **ppcVar38;
  ulong uVar39;
  pointer pLVar40;
  bool bVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar68;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> db;
  size_type __dnew;
  ConversionSchema schema;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  shared_ptr<Assimp::IOStream> stream;
  ConversionData conv;
  unz_file_info fileInfo;
  _Head_base<0UL,_Assimp::STEP::DB_*,_false> local_4b0;
  string local_4a8;
  float local_484;
  float local_480;
  float local_47c;
  float local_478;
  float local_474;
  _Base_ptr local_470;
  string local_468;
  undefined1 local_448 [32];
  _Base_ptr local_428;
  size_t local_420;
  undefined8 *local_418;
  long lStack_410;
  long local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  float local_3dc;
  float local_3d8;
  float local_3d4;
  float local_3d0;
  float local_3cc;
  float local_3c8;
  float local_3c4;
  float local_3c0;
  float local_3bc;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [32];
  IfcProject *local_368;
  aiScene *local_360;
  undefined1 local_358 [64];
  double local_318;
  double dStack_310;
  double local_308;
  double local_300;
  double dStack_2f8;
  _func_int **local_2f0;
  _Base_bitset<1UL> _Stack_2e8;
  double local_2e0;
  pointer local_2d8;
  pointer ppaStack_2d0;
  pointer local_2c8;
  pointer ppaStack_2c0;
  pointer local_2b8;
  pointer ppaStack_2b0;
  _Rb_tree_node_base local_2a0;
  size_t local_280;
  _Rb_tree_node_base local_270;
  size_t local_250;
  Settings *local_248;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *local_240;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvStack_238;
  _Rb_tree_node_base local_228;
  size_t local_208;
  shared_ptr<Assimp::IOStream> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [4];
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b8;
  undefined8 uStack_1a8;
  float local_1a0;
  undefined8 local_19c;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  ios_base local_158 [264];
  long *local_50 [2];
  long local_40 [2];
  
  local_388._0_8_ = local_388 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"rb","");
  iVar13 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_388._0_8_);
  local_3b8._M_ptr = (element_type *)CONCAT44(extraout_var,iVar13);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_3b8._M_refcount,local_3b8._M_ptr);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if (local_3b8._M_ptr == (IOStream *)0x0) {
    local_388._0_8_ = local_388 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_388,"Could not open file for reading","");
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_388);
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
  }
  BaseImporter::GetExtension((string *)local_388,pFile);
  iVar13 = std::__cxx11::string::compare(local_388);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if (iVar13 == 0) {
    lVar15 = unzOpen((pFile->_M_dataplus)._M_p);
    if (lVar15 == 0) {
      local_388._0_8_ = local_388 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_388,"Could not open ifczip file for reading, unzip failed","");
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_388);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
      }
    }
    std::__cxx11::string::substr((ulong)local_448,(ulong)pFile);
    lVar16 = std::__cxx11::string::rfind((char)pFile,0x5c);
    if (lVar16 == -1) {
      lVar16 = std::__cxx11::string::rfind((char)pFile,0x2f);
    }
    if (lVar16 != -1) {
      std::__cxx11::string::substr((ulong)local_388,(ulong)local_448);
      std::__cxx11::string::operator=((string *)local_448,(string *)local_388);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
      }
    }
    iVar13 = unzGoToFirstFile(lVar15);
    if (iVar13 == 0) {
      do {
        unzGetCurrentFileInfo(lVar15,local_1c8,local_388,0x100,0,0,0,0);
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        sVar17 = strlen(local_388);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_468,local_388,local_388 + sVar17);
        BaseImporter::GetExtension(&local_4a8,&local_468);
        iVar13 = std::__cxx11::string::compare((char *)&local_4a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
        }
      } while (iVar13 != 0);
      puVar18 = (uint8_t *)operator_new__(CONCAT44(fStack_18c,fStack_190));
      LogFunctions<Assimp::IFCImporter>::LogInfo((char *)0x509132);
      unzOpenCurrentFile(lVar15);
      lVar16 = 0;
      do {
        uVar39 = CONCAT44(fStack_18c,fStack_190);
        if (0x7ffe < uVar39) {
          uVar39 = 0x7fff;
        }
        pvVar23 = malloc(uVar39);
        uVar14 = unzReadCurrentFile(lVar15,pvVar23,uVar39 & 0xffffffff);
        if (0 < (int)uVar14) {
          memcpy(puVar18 + lVar16,pvVar23,(ulong)uVar14);
          lVar16 = lVar16 + (ulong)uVar14;
        }
        free(pvVar23);
      } while (0 < (int)uVar14);
      if ((lVar16 == 0) || (lVar16 != CONCAT44(fStack_18c,fStack_190))) {
        operator_delete__(puVar18);
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4a8,"Failed to decompress IFC ZIP file","");
        LogFunctions<Assimp::IFCImporter>::ThrowException(&local_4a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
      }
      unzCloseCurrentFile(lVar15);
      __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
      (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_0082b6f8;
      __p->buffer = puVar18;
      __p->length = CONCAT44(fStack_18c,fStack_190);
      __p->pos = 0;
      __p->own = true;
      std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
                (&local_3b8,__p);
    }
    else {
      local_388._0_8_ = local_388 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_388,"Found no IFC file member in IFCZIP file (2)","");
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_388);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
      }
    }
    unzClose(lVar15);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
  }
  local_1f8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_3b8._M_ptr;
  local_1f8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3b8._M_refcount._M_pi;
  if (local_3b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3b8._M_refcount._M_pi)->_M_use_count = (local_3b8._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3b8._M_refcount._M_pi)->_M_use_count = (local_3b8._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_4b0._M_head_impl = STEP::ReadFileHeader(&local_1f8);
  if (local_1f8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Var8._M_head_impl = local_4b0._M_head_impl;
  __rhs = &((local_4b0._M_head_impl)->header).fileSchema;
  if (((local_4b0._M_head_impl)->header).fileSchema._M_string_length == 0) {
    bVar41 = true;
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)__rhs);
    iVar13 = std::__cxx11::string::compare((char *)local_50);
    bVar41 = iVar13 != 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  if (bVar41) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                   "Unrecognized file schema: ",__rhs);
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_388);
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
  }
  bVar41 = DefaultLogger::isNullLogger();
  if (!bVar41) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
                   "File schema is \'",__rhs);
    plVar19 = (long *)std::__cxx11::string::_M_replace_aux
                                ((ulong)local_448,CONCAT44(local_448._12_4_,local_448._8_4_),0,
                                 '\x01');
    paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar19 == paVar34) {
      sVar4 = paVar34->_M_allocated_capacity;
      lVar15 = plVar19[3];
      aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
      aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
      aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
      aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
      aStack_1b8._8_3_ = (undefined3)lVar15;
      aStack_1b8._M_local_buf[0xb] = (char)((ulong)lVar15 >> 0x18);
      aStack_1b8._12_4_ = (undefined4)((ulong)lVar15 >> 0x20);
      _local_1c8 = (pointer)&aStack_1b8;
    }
    else {
      sVar4 = paVar34->_M_allocated_capacity;
      aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
      aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
      aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
      aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
      _local_1c8 = (pointer)*plVar19;
    }
    fStack_1c0 = (float)plVar19[1];
    fStack_1bc = (float)((ulong)plVar19[1] >> 0x20);
    *plVar19 = (long)paVar34;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_388,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_388);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
    std::ios_base::~ios_base((ios_base *)&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8,
                      CONCAT17(aStack_1b8._M_local_buf[7],
                               CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1b8._M_local_buf[4],
                                                 aStack_1b8._M_allocated_capacity._0_4_))) + 1);
    }
    pcVar3 = local_448 + 0x10;
    if ((pointer)local_448._0_8_ != pcVar3) {
      operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
    }
    if (((_Var8._M_head_impl)->header).timestamp._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
                     "Timestamp \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var8._M_head_impl);
      plVar19 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_448,CONCAT44(local_448._12_4_,local_448._8_4_),0,
                                   '\x01');
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 == paVar34) {
        sVar4 = paVar34->_M_allocated_capacity;
        lVar15 = plVar19[3];
        aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
        aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
        aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
        aStack_1b8._8_3_ = (undefined3)lVar15;
        aStack_1b8._M_local_buf[0xb] = (char)((ulong)lVar15 >> 0x18);
        aStack_1b8._12_4_ = (undefined4)((ulong)lVar15 >> 0x20);
        _local_1c8 = (pointer)&aStack_1b8;
      }
      else {
        sVar4 = paVar34->_M_allocated_capacity;
        aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
        aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
        aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
        _local_1c8 = (pointer)*plVar19;
      }
      fStack_1c0 = (float)plVar19[1];
      fStack_1bc = (float)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)paVar34;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_388);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
      std::ios_base::~ios_base((ios_base *)&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1c8 != &aStack_1b8) {
        operator_delete(_local_1c8,
                        CONCAT17(aStack_1b8._M_local_buf[7],
                                 CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                          CONCAT14(aStack_1b8._M_local_buf[4],
                                                   aStack_1b8._M_allocated_capacity._0_4_))) + 1);
      }
      if ((pointer)local_448._0_8_ != pcVar3) {
        operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
      }
    }
    if (((_Var8._M_head_impl)->header).app._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
                     "Application/Exporter identline is \'",&((_Var8._M_head_impl)->header).app);
      plVar19 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)local_448,CONCAT44(local_448._12_4_,local_448._8_4_),0,
                                   '\x01');
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 == paVar34) {
        sVar4 = paVar34->_M_allocated_capacity;
        lVar15 = plVar19[3];
        aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
        aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
        aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
        aStack_1b8._8_3_ = (undefined3)lVar15;
        aStack_1b8._M_local_buf[0xb] = (char)((ulong)lVar15 >> 0x18);
        aStack_1b8._12_4_ = (undefined4)((ulong)lVar15 >> 0x20);
        _local_1c8 = (pointer)&aStack_1b8;
      }
      else {
        sVar4 = paVar34->_M_allocated_capacity;
        aStack_1b8._M_allocated_capacity._0_4_ = (undefined4)sVar4;
        aStack_1b8._M_local_buf[4] = (char)(sVar4 >> 0x20);
        aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)(sVar4 >> 0x28);
        aStack_1b8._M_local_buf[7] = (char)(sVar4 >> 0x38);
        _local_1c8 = (pointer)*plVar19;
      }
      fStack_1c0 = (float)plVar19[1];
      fStack_1bc = (float)((ulong)plVar19[1] >> 0x20);
      *plVar19 = (long)paVar34;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
      LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_388);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
      std::ios_base::~ios_base((ios_base *)&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1c8 != &aStack_1b8) {
        operator_delete(_local_1c8,
                        CONCAT17(aStack_1b8._M_local_buf[7],
                                 CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                          CONCAT14(aStack_1b8._M_local_buf[4],
                                                   aStack_1b8._M_allocated_capacity._0_4_))) + 1);
      }
      if ((pointer)local_448._0_8_ != pcVar3) {
        operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
      }
    }
  }
  local_448._24_8_ = local_448 + 8;
  local_448._8_4_ = _S_red;
  local_448._16_8_ = 0;
  local_420 = 0;
  local_428 = (_Base_ptr)local_448._24_8_;
  Assimp::IFC::Schema_2x3::GetSchema((ConversionSchema *)local_448);
  ppcVar38 = InternReadFile::inverse_indices_to_track;
  STEP::ReadFile(local_4b0._M_head_impl,(ConversionSchema *)local_448,InternReadFile::types_to_track
                 ,3,InternReadFile::inverse_indices_to_track,6);
  _Var8._M_head_impl = local_4b0._M_head_impl;
  local_388._0_8_ = local_388 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"ifcproject","");
  cVar20 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find(&((_Var8._M_head_impl)->objects_bytype)._M_t,(key_type *)local_388);
  if (((_Rb_tree_header *)cVar20._M_node ==
       &((_Var8._M_head_impl)->objects_bytype)._M_t._M_impl.super__Rb_tree_header) ||
     (cVar20._M_node[3]._M_parent == (_Base_ptr)0x0)) {
    pLVar27 = (LazyObject *)0x0;
  }
  else {
    pLVar27 = *(LazyObject **)(cVar20._M_node[2]._M_right + 1);
  }
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if (pLVar27 == (LazyObject *)0x0) {
    local_388._0_8_ = local_388 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_388,"missing IfcProject entity","");
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_388);
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
  }
  _Var8._M_head_impl = local_4b0._M_head_impl;
  local_368 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProject>(pLVar27);
  local_248 = &this->settings;
  local_2a0._M_left = &local_2a0;
  local_388._0_8_ = (pointer)0x3ff0000000000000;
  local_388._8_8_ = -1.0;
  local_388._24_8_ = _Var8._M_head_impl;
  local_358._0_8_ = 1.0;
  local_358._8_8_ = 0.0;
  local_358._16_8_ = 0.0;
  local_358._24_8_ = 0.0;
  local_358._32_8_ = 0.0;
  local_358._40_8_ = 1.0;
  local_358._48_8_ = 0.0;
  local_358._56_8_ = 0.0;
  local_318 = 0.0;
  dStack_310 = 0.0;
  local_308 = 1.0;
  local_300 = 0.0;
  dStack_2f8 = 0.0;
  local_2f0 = (_func_int **)0x0;
  _Stack_2e8._M_w = 0;
  local_2e0 = 1.0;
  local_2a0._M_color = _S_red;
  local_2a0._M_parent = (_Base_ptr)0x0;
  local_2b8 = (pointer)0x0;
  ppaStack_2b0 = (pointer)0x0;
  local_2c8 = (pointer)0x0;
  ppaStack_2c0 = (pointer)0x0;
  local_2d8 = (pointer)0x0;
  ppaStack_2d0 = (pointer)0x0;
  local_280 = 0;
  local_270._M_left = &local_270;
  local_270._M_color = _S_red;
  local_270._M_parent = (_Base_ptr)0x0;
  local_250 = 0;
  local_228._M_left = &local_228;
  local_228._M_color = _S_red;
  local_228._M_parent = (_Base_ptr)0x0;
  local_240 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  pvStack_238 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0;
  local_208 = 0;
  local_360 = pScene;
  local_2a0._M_right = local_2a0._M_left;
  local_270._M_right = local_270._M_left;
  local_228._M_right = local_228._M_left;
  pIVar21 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                      ((local_368->UnitsInContext).obj);
  if (*(long *)&(pIVar21->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                field_0x18 !=
      *(long *)&(pIVar21->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                field_0x10) {
    lVar15 = 0;
    uVar39 = 0;
    do {
      pIVar21 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                          ((local_368->UnitsInContext).obj);
      anon_unknown.dwarf_e46b9e::ConvertUnit
                (*(DataType **)
                  (*(long *)&(pIVar21->
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>).
                             field_0x10 + lVar15),(ConversionData *)local_388);
      pIVar21 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcUnitAssignment>
                          ((local_368->UnitsInContext).obj);
      uVar39 = uVar39 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar39 < (ulong)(*(long *)&(pIVar21->
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>
                                        ).field_0x18 -
                              *(long *)&(pIVar21->
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcUnitAssignment,_1UL>
                                        ).field_0x10 >> 4));
  }
  pLVar40 = (local_368->RepresentationContexts).
            super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
            .
            super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar5 = (local_368->RepresentationContexts).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar40 == pLVar5) {
    pIVar22 = (IfcRepresentationContext *)0x0;
  }
  else {
    do {
      pIVar22 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentationContext>
                          (pLVar40->obj);
      if ((pIVar22->ContextType).have == true) {
        iVar13 = std::__cxx11::string::compare((char *)&pIVar22->ContextType);
        if (iVar13 == 0) break;
      }
      pLVar40 = pLVar40 + 1;
    } while (pLVar40 != pLVar5);
  }
  if (pIVar22 != (IfcRepresentationContext *)0x0) {
    lVar15 = __dynamic_cast((_func_int *)
                            ((long)&(pIVar22->
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                                    )._vptr_ObjectHelper +
                            (long)(pIVar22->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                                  )._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                            &Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::typeinfo,
                            0xffffffffffffffff);
    if (lVar15 != 0) {
      Assimp::IFC::ConvertAxisPlacement
                ((IfcMatrix4 *)local_358,*(IfcAxis2Placement **)(lVar15 + 0x88),
                 (ConversionData *)local_388);
      LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x509a17);
    }
  }
  uVar36 = local_388._24_8_;
  this_00 = (ObjectMapByType *)(local_388._24_8_ + 0x90);
  aStack_1b8._M_allocated_capacity._0_4_ = 0x73636669;
  aStack_1b8._M_local_buf[4] = 'i';
  aStack_1b8._M_allocated_capacity._5_2_ = 0x6574;
  fStack_1c0 = 9.80909e-45;
  fStack_1bc = 0.0;
  aStack_1b8._7_4_ = aStack_1b8._7_4_ & 0xffffff00;
  _local_1c8 = (pointer)&aStack_1b8;
  cVar20 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                   *)this_00,(key_type *)local_1c8);
  if (cVar20._M_node == (_Base_ptr)(uVar36 + 0x98)) {
    __assert_fail("map.find(\"ifcsite\") != map.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCLoader.cpp"
                  ,0x374,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_1c8 != &aStack_1b8) {
    operator_delete(_local_1c8,
                    CONCAT17(aStack_1b8._M_local_buf[7],
                             CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                      CONCAT14(aStack_1b8._M_local_buf[4],
                                               aStack_1b8._M_allocated_capacity._0_4_))) + 1);
  }
  aStack_1b8._M_allocated_capacity._0_4_ = 0x73636669;
  aStack_1b8._M_local_buf[4] = 'i';
  aStack_1b8._M_allocated_capacity._5_2_ = 0x6574;
  fStack_1c0 = 9.80909e-45;
  fStack_1bc = 0.0;
  aStack_1b8._7_4_ = aStack_1b8._7_4_ & 0xffffff00;
  _local_1c8 = (pointer)&aStack_1b8;
  cVar20 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                   *)this_00,(key_type *)local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_1c8 != &aStack_1b8) {
    operator_delete(_local_1c8,
                    CONCAT17(aStack_1b8._M_local_buf[7],
                             CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                      CONCAT14(aStack_1b8._M_local_buf[4],
                                               aStack_1b8._M_allocated_capacity._0_4_))) + 1);
  }
  if (cVar20._M_node[3]._M_parent == (_Base_ptr)0x0) {
    aStack_1b8._M_allocated_capacity._0_4_ = 0x62636669;
    aStack_1b8._M_local_buf[4] = 'u';
    aStack_1b8._M_allocated_capacity._5_2_ = 0x6c69;
    aStack_1b8._7_4_ = 0x676e6964;
    fStack_1c0 = 1.54143e-44;
    fStack_1bc = 0.0;
    aStack_1b8._M_local_buf[0xb] = '\0';
    _local_1c8 = (pointer)&aStack_1b8;
    cVar20 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                     *)this_00,(key_type *)local_1c8);
    if (cVar20._M_node == (_Base_ptr)(uVar36 + 0x98)) {
      __assert_fail("map.find(\"ifcbuilding\") != map.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCLoader.cpp"
                    ,0x378,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)")
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8,
                      CONCAT17(aStack_1b8._M_local_buf[7],
                               CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1b8._M_local_buf[4],
                                                 aStack_1b8._M_allocated_capacity._0_4_))) + 1);
    }
    aStack_1b8._M_allocated_capacity._0_4_ = 0x62636669;
    aStack_1b8._M_local_buf[4] = 'u';
    aStack_1b8._M_allocated_capacity._5_2_ = 0x6c69;
    aStack_1b8._7_4_ = 0x676e6964;
    fStack_1c0 = 1.54143e-44;
    fStack_1bc = 0.0;
    aStack_1b8._M_local_buf[0xb] = '\0';
    _local_1c8 = (pointer)&aStack_1b8;
    cVar20 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
                     *)this_00,(key_type *)local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8,
                      CONCAT17(aStack_1b8._M_local_buf[7],
                               CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1b8._M_local_buf[4],
                                                 aStack_1b8._M_allocated_capacity._0_4_))) + 1);
    }
    if (cVar20._M_node[3]._M_parent == (_Base_ptr)0x0) {
      local_4a8._M_dataplus._M_p = (pointer)0x42;
      _local_1c8 = (pointer)&aStack_1b8;
      pvVar23 = (void *)std::__cxx11::string::_M_create((ulong *)local_1c8,(ulong)&local_4a8);
      _Var7._M_p = local_4a8._M_dataplus._M_p;
      local_1c8 = SUB84(pvVar23,0);
      fStack_1c4 = (float)((ulong)pvVar23 >> 0x20);
      aStack_1b8._M_allocated_capacity._0_4_ = SUB84(local_4a8._M_dataplus._M_p,0);
      uVar12 = aStack_1b8._M_allocated_capacity._0_4_;
      aStack_1b8._M_local_buf[4] = (char)((ulong)local_4a8._M_dataplus._M_p >> 0x20);
      aStack_1b8._M_allocated_capacity._5_2_ =
           (undefined2)((ulong)local_4a8._M_dataplus._M_p >> 0x28);
      aStack_1b8._M_local_buf[7] = (char)((ulong)local_4a8._M_dataplus._M_p >> 0x38);
      memcpy(pvVar23,"no root element found (expected IfcBuilding or preferably IfcSite)",0x42);
      fStack_1bc = (float)((ulong)_Var7._M_p >> 0x20);
      *(char *)((long)pvVar23 + (long)_Var7._M_p) = '\0';
      fStack_1c0 = (float)uVar12;
      LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_1c8 != &aStack_1b8) {
        operator_delete(_local_1c8,
                        CONCAT17(aStack_1b8._M_local_buf[7],
                                 CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                          CONCAT14(aStack_1b8._M_local_buf[4],
                                                   aStack_1b8._M_allocated_capacity._0_4_))) + 1);
      }
    }
  }
  local_418 = (undefined8 *)0x0;
  lStack_410 = 0;
  local_408 = 0;
  p_Var31 = cVar20._M_node[2]._M_right;
  pp_Var1 = &cVar20._M_node[2]._M_parent;
  local_470 = cVar20._M_node;
  if (p_Var31 != (_Base_ptr)pp_Var1) {
    do {
      pOVar24 = STEP::LazyObject::operator*(*(LazyObject **)(p_Var31 + 1));
      paVar25 = (aiNode *)
                __dynamic_cast(pOVar24,&STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::typeinfo,
                               0xffffffffffffffff);
      _Var7._M_p = _local_1c8;
      if (paVar25 != (aiNode *)0x0) {
        if ((paVar25->mName).data[0x54] == '\x01') {
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          lVar15 = *(long *)((paVar25->mName).data + 0x34);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3a8,lVar15,*(long *)((paVar25->mName).data + 0x3c) + lVar15);
        }
        else {
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          local_3a8.field_2._M_allocated_capacity._0_4_ = 0x616e6e75;
          local_3a8._M_string_length = 7;
          local_3a8.field_2._M_allocated_capacity._4_4_ = 0x64656d;
        }
        std::operator+(&local_1e8,"looking at spatial structure `",&local_3a8);
        paVar34 = &local_468.field_2;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        puVar35 = (ulong *)(plVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar35) {
          local_468.field_2._M_allocated_capacity = *puVar35;
          local_468.field_2._8_8_ = plVar19[3];
          local_468._M_dataplus._M_p = (pointer)paVar34;
        }
        else {
          local_468.field_2._M_allocated_capacity = *puVar35;
          local_468._M_dataplus._M_p = (pointer)*plVar19;
        }
        local_468._M_string_length = plVar19[1];
        *plVar19 = (long)puVar35;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        if ((paVar25->mName).data[0xc4] == '\x01') {
          std::operator+(&local_400," which is of type ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((paVar25->mName).data + 0xa4));
        }
        else {
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          local_400._M_string_length = 0;
          local_400.field_2._M_local_buf[0] = '\0';
        }
        uVar36 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != paVar34) {
          uVar36 = local_468.field_2._M_allocated_capacity;
        }
        uVar39 = (long)&(((_Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                           *)local_468._M_string_length)->_M_impl).super__Vector_impl_data._M_start
                 + local_400._M_string_length;
        ppcVar38 = (char **)local_468._M_string_length;
        if ((ulong)uVar36 < uVar39) {
          uVar37 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            uVar37 = CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                              local_400.field_2._M_local_buf[0]);
          }
          if (uVar37 < uVar39) goto LAB_00509e1d;
          puVar26 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_400,0,(char *)0x0,(ulong)local_468._M_dataplus._M_p);
        }
        else {
LAB_00509e1d:
          puVar26 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_468,(ulong)local_400._M_dataplus._M_p);
        }
        psVar2 = puVar26 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar26 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_4a8.field_2._M_allocated_capacity = *psVar2;
          local_4a8.field_2._8_8_ = puVar26[3];
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        }
        else {
          local_4a8.field_2._M_allocated_capacity = *psVar2;
          local_4a8._M_dataplus._M_p = (pointer)*puVar26;
        }
        local_4a8._M_string_length = puVar26[1];
        *puVar26 = psVar2;
        puVar26[1] = 0;
        *(undefined1 *)psVar2 = 0;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1c8,
                   &local_4a8);
        LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != &local_400.field_2) {
          operator_delete(local_400._M_dataplus._M_p,
                          CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                                   local_400.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != paVar34) {
          operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,
                          CONCAT44(local_3a8.field_2._M_allocated_capacity._4_4_,
                                   local_3a8.field_2._M_allocated_capacity._0_4_) + 1);
        }
        uVar36 = *(undefined8 *)
                  (&(local_368->super_IfcObject).field_0x8 +
                  *(long *)(*(long *)&local_368->super_IfcObject + -0x18));
        local_1c8 = SUB84(uVar36,0);
        fStack_1c4 = (float)((ulong)uVar36 >> 0x20);
        pVar68 = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)(local_388._24_8_ + 0xc0),(key_type_conflict1 *)local_1c8);
        _Var7._M_p = (pointer)CONCAT44(fStack_1c4,local_1c8);
        _Var30 = pVar68.first._M_node;
        while (_Var30._M_node != pVar68.second._M_node._M_node) {
          pLVar27 = STEP::DB::GetObject((DB *)local_388._24_8_,(uint64_t)_Var30._M_node[1]._M_parent
                                       );
          pOVar24 = STEP::LazyObject::operator*(pLVar27);
          lVar15 = __dynamic_cast(pOVar24,&STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelAggregates::typeinfo,
                                  0xffffffffffffffff);
          if (lVar15 != 0) {
            puVar6 = *(undefined8 **)(lVar15 + 0xb8);
            for (puVar26 = *(undefined8 **)(lVar15 + 0xb0); puVar26 != puVar6; puVar26 = puVar26 + 1
                ) {
              pIVar28 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  ((LazyObject *)*puVar26);
              if (*(long *)((long)&(pIVar28->super_IfcRoot).
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                   aux_is_derived.super__Base_bitset<1UL>._M_w +
                           (long)(pIVar28->super_IfcRoot).
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                 _vptr_ObjectHelper[-3]) ==
                  *(long *)((paVar25->mName).data + *(long *)(*(long *)&paVar25->mName + -0x18) + 4)
                 ) {
                LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x50a023);
                paVar29 = anon_unknown.dwarf_e46b9e::ProcessSpatialStructure
                                    ((anon_unknown_dwarf_e46b9e *)0x0,paVar25,
                                     (IfcProduct *)local_388,(ConversionData *)0x0,
                                     (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                      *)ppcVar38);
                local_1c8 = SUB84(paVar29,0);
                fStack_1c4 = (float)((ulong)paVar29 >> 0x20);
                std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                          ((vector<aiNode*,std::allocator<aiNode*>> *)&local_418,
                           (aiNode **)local_1c8);
              }
            }
          }
          _Var30._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var30._M_node);
          _Var7._M_p = (pointer)CONCAT44(fStack_1c4,local_1c8);
        }
      }
      _local_1c8 = _Var7._M_p;
      p_Var31 = (_Base_ptr)std::_Rb_tree_increment(p_Var31);
    } while (p_Var31 != (_Base_ptr)pp_Var1);
  }
  lVar15 = lStack_410 - (long)local_418;
  if (lVar15 == 0) {
    LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x50a0a0);
    p_Var31 = local_470[2]._M_right;
    if (p_Var31 != (_Base_ptr)pp_Var1) {
      do {
        pOVar24 = STEP::LazyObject::operator*(*(LazyObject **)(p_Var31 + 1));
        paVar25 = (aiNode *)
                  __dynamic_cast(pOVar24,&STEP::Object::typeinfo,
                                 &Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::typeinfo);
        if (paVar25 != (aiNode *)0x0) {
          paVar25 = anon_unknown.dwarf_e46b9e::ProcessSpatialStructure
                              ((anon_unknown_dwarf_e46b9e *)0x0,paVar25,(IfcProduct *)local_388,
                               (ConversionData *)0x0,
                               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                *)ppcVar38);
          local_1c8 = SUB84(paVar25,0);
          fStack_1c4 = (float)((ulong)paVar25 >> 0x20);
          std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                    ((vector<aiNode*,std::allocator<aiNode*>> *)&local_418,(aiNode **)local_1c8);
        }
        p_Var31 = (_Base_ptr)std::_Rb_tree_increment(p_Var31);
      } while (p_Var31 != (_Base_ptr)pp_Var1);
    }
    lVar15 = lStack_410 - (long)local_418;
  }
  lVar16 = lVar15 >> 3;
  if (lVar16 == 0) {
    local_4a8._M_dataplus._M_p = &DAT_00000028;
    _local_1c8 = (pointer)&aStack_1b8;
    pcVar32 = (char *)std::__cxx11::string::_M_create((ulong *)local_1c8,(ulong)&local_4a8);
    local_1c8 = SUB84(pcVar32,0);
    fStack_1c4 = (float)((ulong)pcVar32 >> 0x20);
    aStack_1b8._M_allocated_capacity._0_4_ = SUB84(local_4a8._M_dataplus._M_p,0);
    aStack_1b8._M_local_buf[4] = (char)((ulong)local_4a8._M_dataplus._M_p >> 0x20);
    aStack_1b8._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_4a8._M_dataplus._M_p >> 0x28)
    ;
    aStack_1b8._M_local_buf[7] = (char)((ulong)local_4a8._M_dataplus._M_p >> 0x38);
    builtin_strncpy(pcVar32,"failed to determine primary site element",0x28);
    fStack_1bc = (float)((ulong)local_4a8._M_dataplus._M_p >> 0x20);
    pcVar32[(long)local_4a8._M_dataplus._M_p] = '\0';
    fStack_1c0 = (float)aStack_1b8._M_allocated_capacity._0_4_;
    LogFunctions<Assimp::IFCImporter>::ThrowException((string *)local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8,
                      CONCAT17(aStack_1b8._M_local_buf[7],
                               CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1b8._M_local_buf[4],
                                                 aStack_1b8._M_allocated_capacity._0_4_))) + 1);
    }
  }
  else if (lVar16 == 1) {
    local_360->mRootNode = (aiNode *)*local_418;
  }
  else {
    paVar25 = (aiNode *)operator_new(0x478);
    aStack_1b8._M_allocated_capacity._0_4_ = 0x746f6f52;
    fStack_1c0 = 5.60519e-45;
    fStack_1bc = 0.0;
    aStack_1b8._M_local_buf[4] = '\0';
    _local_1c8 = (pointer)&aStack_1b8;
    aiNode::aiNode(paVar25,(string *)local_1c8);
    local_360->mRootNode = paVar25;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_1c8 != &aStack_1b8) {
      operator_delete(_local_1c8,
                      CONCAT17(aStack_1b8._M_local_buf[7],
                               CONCAT25(aStack_1b8._M_allocated_capacity._5_2_,
                                        CONCAT14(aStack_1b8._M_local_buf[4],
                                                 aStack_1b8._M_allocated_capacity._0_4_))) + 1);
    }
    paVar9 = local_360;
    local_360->mRootNode->mParent = (aiNode *)0x0;
    local_360->mRootNode->mNumChildren = (uint)lVar16;
    ppaVar33 = (aiNode **)operator_new__((ulong)local_360->mRootNode->mNumChildren << 3);
    paVar9->mRootNode->mChildren = ppaVar33;
    if (lVar15 != 0) {
      lVar15 = 0;
      do {
        paVar25 = (aiNode *)local_418[lVar15];
        paVar25->mParent = local_360->mRootNode;
        local_360->mRootNode->mChildren[lVar15] = paVar25;
        lVar15 = lVar15 + 1;
      } while (lVar16 + (ulong)(lVar16 == 0) != lVar15);
    }
  }
  if (local_418 != (undefined8 *)0x0) {
    operator_delete(local_418,local_408 - (long)local_418);
  }
  local_1c8 = (undefined1  [4])0x3f800000;
  fStack_1c4 = 0.0;
  fStack_1c0 = 0.0;
  fStack_1bc = 0.0;
  aStack_1b8._M_allocated_capacity._0_4_ = 0;
  aStack_1b8._M_local_buf[4] = '\0';
  aStack_1b8._M_allocated_capacity._5_2_ = 0x8000;
  aStack_1b8._7_4_ = 0x3f;
  aStack_1b8._M_local_buf[0xb] = '\0';
  aStack_1b8._12_4_ = 0;
  uStack_1a8 = 0;
  local_1a0 = 1.0;
  local_19c = 0;
  fStack_194 = 0.0;
  fStack_190 = 0.0;
  fStack_18c = 1.0;
  anon_unknown.dwarf_e46b9e::MakeTreeRelative(local_360->mRootNode,(aiMatrix4x4 *)local_1c8);
  ppaVar10 = ppaStack_2d0;
  __src = local_2d8;
  uVar39 = (long)ppaStack_2d0 - (long)local_2d8;
  if (uVar39 != 0) {
    pScene->mNumMeshes = (uint)(uVar39 >> 3);
    __s = (aiMesh **)operator_new__(uVar39 & 0x7fffffff8);
    memset(__s,0,uVar39 & 0x7fffffff8);
    pScene->mMeshes = __s;
    if (ppaVar10 != __src) {
      memmove(__s,__src,uVar39);
      ppaStack_2d0 = __src;
    }
  }
  ppaVar11 = local_2b8;
  __src_00 = ppaStack_2c0;
  uVar39 = (long)local_2b8 - (long)ppaStack_2c0;
  if (uVar39 != 0) {
    pScene->mNumMaterials = (uint)(uVar39 >> 3);
    __s_00 = (aiMaterial **)operator_new__(uVar39 & 0x7fffffff8);
    memset(__s_00,0,uVar39 & 0x7fffffff8);
    pScene->mMaterials = __s_00;
    if (ppaVar11 != __src_00) {
      memmove(__s_00,__src_00,uVar39);
      local_2b8 = __src_00;
    }
  }
  fVar62 = (float)(double)local_388._0_8_;
  fVar42 = 0.0 - fVar62;
  fVar54 = (float)(double)local_358._0_8_;
  fVar59 = (float)(double)local_358._8_8_;
  fVar44 = (float)(double)local_358._32_8_;
  fVar52 = fVar62 + 0.0;
  fVar49 = (float)(double)local_358._40_8_;
  fVar55 = (float)local_318;
  fVar48 = fVar62 * 0.0 + 0.0;
  fVar50 = (float)dStack_310;
  fVar63 = fVar62 * -4.371139e-08 + 0.0;
  fVar45 = (float)(double)local_358._16_8_;
  fVar51 = (float)(double)local_358._48_8_;
  fVar46 = (float)local_308;
  fVar58 = fVar48 + 0.0;
  fVar62 = (float)local_300;
  fVar43 = (float)(double)local_358._24_8_;
  fVar56 = (float)(double)local_358._56_8_;
  fVar57 = fVar63 + 0.0;
  local_3bc = fVar54 * fVar58 + fVar48 * fVar44 + fVar55 * fVar58 + (float)dStack_2f8;
  local_478 = (float)dStack_2f8 * 0.0;
  fVar47 = fVar54 * fVar52 + fVar48 * fVar44 + fVar55 * fVar58 + local_478;
  fVar64 = fVar55 * fVar52 + fVar63 * fVar44 + fVar54 * fVar48 + local_478;
  local_478 = fVar55 * fVar57 + fVar44 * fVar42 + fVar54 * fVar48 + local_478;
  fVar60 = fVar59 * fVar58 + fVar48 * fVar49 + fVar50 * fVar58 + (float)(double)local_2f0;
  local_470 = (_Base_ptr)CONCAT44(local_470._4_4_,fVar60);
  local_47c = (float)(double)local_2f0 * 0.0;
  fVar53 = fVar59 * fVar52 + fVar48 * fVar49 + fVar50 * fVar58 + local_47c;
  fVar65 = fVar50 * fVar52 + fVar63 * fVar49 + fVar59 * fVar48 + local_47c;
  local_47c = fVar50 * fVar57 + fVar49 * fVar42 + fVar59 * fVar48 + local_47c;
  local_474 = fVar45 * fVar58 + fVar48 * fVar51 + fVar46 * fVar58 + (float)(double)_Stack_2e8._M_w;
  local_480 = (float)(double)_Stack_2e8._M_w * 0.0;
  fVar59 = fVar45 * fVar52 + fVar48 * fVar51 + fVar46 * fVar58 + local_480;
  fVar66 = fVar46 * fVar52 + fVar63 * fVar51 + fVar45 * fVar48 + local_480;
  local_480 = fVar46 * fVar57 + fVar51 * fVar42 + fVar45 * fVar48 + local_480;
  fVar67 = (float)local_2e0 * 0.0;
  fVar61 = fVar43 * fVar52 + fVar48 * fVar56 + fVar62 * fVar58 + fVar67;
  fVar63 = fVar52 * fVar62 + fVar63 * fVar56 + fVar48 * fVar43 + fVar67;
  fVar67 = fVar57 * fVar62 + fVar42 * fVar56 + fVar48 * fVar43 + fVar67;
  fVar58 = fVar58 * fVar43 + fVar48 * fVar56 + fVar62 * fVar58 + (float)local_2e0;
  paVar25 = pScene->mRootNode;
  fVar42 = (paVar25->mTransformation).b1;
  fVar62 = (paVar25->mTransformation).a1;
  fVar43 = (paVar25->mTransformation).c1;
  fVar44 = (paVar25->mTransformation).d1;
  local_3c0 = fVar44 * fVar61 + fVar43 * fVar59 + fVar62 * fVar47 + fVar53 * fVar42;
  fVar45 = (paVar25->mTransformation).b2;
  fVar46 = (paVar25->mTransformation).a2;
  fVar48 = (paVar25->mTransformation).c2;
  fVar49 = (paVar25->mTransformation).d2;
  local_3c4 = fVar49 * fVar61 + fVar48 * fVar59 + fVar46 * fVar47 + fVar53 * fVar45;
  fVar50 = (paVar25->mTransformation).b3;
  fVar51 = (paVar25->mTransformation).a3;
  fVar52 = (paVar25->mTransformation).c3;
  local_3dc = (paVar25->mTransformation).d3;
  local_3c8 = local_3dc * fVar61 + fVar52 * fVar59 + fVar51 * fVar47 + fVar53 * fVar50;
  fVar54 = (paVar25->mTransformation).b4;
  fVar55 = (paVar25->mTransformation).a4;
  fVar56 = (paVar25->mTransformation).c4;
  fVar57 = (paVar25->mTransformation).d4;
  local_3cc = fVar61 * fVar57 + fVar59 * fVar56 + fVar47 * fVar55 + fVar53 * fVar54;
  local_3d0 = fVar44 * fVar63 + fVar43 * fVar66 + fVar62 * fVar64 + fVar65 * fVar42;
  local_3d4 = fVar49 * fVar63 + fVar48 * fVar66 + fVar46 * fVar64 + fVar65 * fVar45;
  local_3d8 = local_3dc * fVar63 + fVar52 * fVar66 + fVar51 * fVar64 + fVar65 * fVar50;
  local_484 = fVar63 * fVar57 + fVar66 * fVar56 + fVar64 * fVar55 + fVar65 * fVar54;
  (paVar25->mTransformation).a1 = local_3c0;
  (paVar25->mTransformation).a2 = local_3c4;
  (paVar25->mTransformation).a3 = local_3c8;
  (paVar25->mTransformation).a4 = local_3cc;
  (paVar25->mTransformation).b1 = local_3d0;
  (paVar25->mTransformation).b2 = local_3d4;
  (paVar25->mTransformation).b3 = local_3d8;
  (paVar25->mTransformation).b4 = local_484;
  (paVar25->mTransformation).c1 =
       fVar44 * fVar67 + fVar43 * local_480 + fVar62 * local_478 + local_47c * fVar42;
  (paVar25->mTransformation).c2 =
       fVar49 * fVar67 + fVar48 * local_480 + fVar46 * local_478 + local_47c * fVar45;
  (paVar25->mTransformation).c3 =
       local_3dc * fVar67 + fVar52 * local_480 + fVar51 * local_478 + local_47c * fVar50;
  (paVar25->mTransformation).c4 =
       fVar67 * fVar57 + local_480 * fVar56 + local_478 * fVar55 + local_47c * fVar54;
  (paVar25->mTransformation).d1 =
       fVar44 * fVar58 + fVar43 * local_474 + fVar62 * local_3bc + fVar42 * fVar60;
  (paVar25->mTransformation).d2 =
       fVar49 * fVar58 + fVar48 * local_474 + fVar46 * local_3bc + fVar45 * fVar60;
  (paVar25->mTransformation).d3 =
       local_3dc * fVar58 + fVar52 * local_474 + fVar51 * local_3bc + fVar50 * fVar60;
  (paVar25->mTransformation).d4 =
       fVar58 * fVar57 + local_474 * fVar56 + local_3bc * fVar55 + fVar60 * fVar54;
  bVar41 = DefaultLogger::isNullLogger();
  if (!bVar41) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"STEP: evaluated ",0x10)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," object records",0xf);
    LogFunctions<Assimp::IFCImporter>::LogDebug((format *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
  }
  Assimp::IFC::ConversionData::~ConversionData((ConversionData *)local_388);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
               *)local_448);
  std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::~unique_ptr
            ((unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> *)&local_4b0);
  if (local_3b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b8._M_refcount._M_pi);
  }
  return;
}

Assistant:

void IFCImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::shared_ptr<IOStream> stream(pIOHandler->Open(pFile));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }


    // if this is a ifczip file, decompress its contents first
    if(GetExtension(pFile) == "ifczip") {
#ifndef ASSIMP_BUILD_NO_COMPRESSED_IFC
        unzFile zip = unzOpen( pFile.c_str() );
        if(zip == NULL) {
            ThrowException("Could not open ifczip file for reading, unzip failed");
        }

        // chop 'zip' postfix
        std::string fileName = pFile.substr(0,pFile.length() - 3);

        std::string::size_type s = pFile.find_last_of('\\');
        if(s == std::string::npos) {
            s = pFile.find_last_of('/');
        }
        if(s != std::string::npos) {
            fileName = fileName.substr(s+1);
        }

        // search file (same name as the IFCZIP except for the file extension) and place file pointer there
        if(UNZ_OK == unzGoToFirstFile(zip)) {
            do {
                // get file size, etc.
                unz_file_info fileInfo;
                char filename[256];
                unzGetCurrentFileInfo( zip , &fileInfo, filename, sizeof(filename), 0, 0, 0, 0 );
                if (GetExtension(filename) != "ifc") {
                    continue;
                }
                uint8_t* buff = new uint8_t[fileInfo.uncompressed_size];
                LogInfo("Decompressing IFCZIP file");
                unzOpenCurrentFile(zip);
                size_t total = 0;
                int read = 0;
                do {
                    int bufferSize = fileInfo.uncompressed_size < INT16_MAX ? fileInfo.uncompressed_size : INT16_MAX;
                    void* buffer = malloc(bufferSize);
                    read = unzReadCurrentFile(zip, buffer, bufferSize);
                    if (read > 0) {
                        memcpy((char*)buff + total, buffer, read);
                        total += read;
                    }
                    free(buffer);
                } while (read > 0);
                size_t filesize = fileInfo.uncompressed_size;
                if (total == 0 || size_t(total) != filesize)
                {
                    delete[] buff;
                    ThrowException("Failed to decompress IFC ZIP file");
                }
                unzCloseCurrentFile( zip );
                stream.reset(new MemoryIOStream(buff,fileInfo.uncompressed_size,true));
                break;

                if (unzGoToNextFile(zip) == UNZ_END_OF_LIST_OF_FILE) {
                    ThrowException("Found no IFC file member in IFCZIP file (1)");
                }

            } while(true);
        }
        else {
            ThrowException("Found no IFC file member in IFCZIP file (2)");
        }

        unzClose(zip);
#else
        ThrowException("Could not open ifczip file for reading, assimp was built without ifczip support");
#endif
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(stream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();

    if(!head.fileSchema.size() || head.fileSchema.substr(0,3) != "IFC") {
        ThrowException("Unrecognized file schema: " + head.fileSchema);
    }

    if (!DefaultLogger::isNullLogger()) {
        LogDebug("File schema is \'" + head.fileSchema + '\'');
        if (head.timestamp.length()) {
            LogDebug("Timestamp \'" + head.timestamp + '\'');
        }
        if (head.app.length()) {
            LogDebug("Application/Exporter identline is \'" + head.app  + '\'');
        }
    }

    // obtain a copy of the machine-generated IFC scheme
    ::Assimp::STEP::EXPRESS::ConversionSchema schema;
    Schema_2x3::GetSchema(schema);

    // tell the reader which entity types to track with special care
    static const char* const types_to_track[] = {
        "ifcsite", "ifcbuilding", "ifcproject"
    };

    // tell the reader for which types we need to simulate STEPs reverse indices
    static const char* const inverse_indices_to_track[] = {
        "ifcrelcontainedinspatialstructure", "ifcrelaggregates", "ifcrelvoidselement", "ifcreldefinesbyproperties", "ifcpropertyset", "ifcstyleditem"
    };

    // feed the IFC schema into the reader and pre-parse all lines
    STEP::ReadFile(*db, schema, types_to_track, inverse_indices_to_track);
    const STEP::LazyObject* proj =  db->GetObject("ifcproject");
    if (!proj) {
        ThrowException("missing IfcProject entity");
    }

    ConversionData conv(*db,proj->To<Schema_2x3::IfcProject>(),pScene,settings);
    SetUnits(conv);
    SetCoordinateSpace(conv);
    ProcessSpatialStructures(conv);
    MakeTreeRelative(conv);

    // NOTE - this is a stress test for the importer, but it works only
    // in a build with no entities disabled. See
    //     scripts/IFCImporter/CPPGenerator.py
    // for more information.
    #ifdef ASSIMP_IFC_TEST
        db->EvaluateAll();
    #endif

    // do final data copying
    if (conv.meshes.size()) {
        pScene->mNumMeshes = static_cast<unsigned int>(conv.meshes.size());
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes]();
        std::copy(conv.meshes.begin(),conv.meshes.end(),pScene->mMeshes);

        // needed to keep the d'tor from burning us
        conv.meshes.clear();
    }

    if (conv.materials.size()) {
        pScene->mNumMaterials = static_cast<unsigned int>(conv.materials.size());
        pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials]();
        std::copy(conv.materials.begin(),conv.materials.end(),pScene->mMaterials);

        // needed to keep the d'tor from burning us
        conv.materials.clear();
    }

    // apply world coordinate system (which includes the scaling to convert to meters and a -90 degrees rotation around x)
    aiMatrix4x4 scale, rot;
    aiMatrix4x4::Scaling(static_cast<aiVector3D>(IfcVector3(conv.len_scale)),scale);
    aiMatrix4x4::RotationX(-AI_MATH_HALF_PI_F,rot);

    pScene->mRootNode->mTransformation = rot * scale * conv.wcs * pScene->mRootNode->mTransformation;

    // this must be last because objects are evaluated lazily as we process them
    if ( !DefaultLogger::isNullLogger() ){
        LogDebug((Formatter::format(),"STEP: evaluated ",db->GetEvaluatedObjectCount()," object records"));
    }
}